

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intCheck.c
# Opt level: O2

Aig_Man_t * Inter_ManUnrollFrames(Aig_Man_t *pAig,int nFrames)

{
  int iVar1;
  Aig_Man_t *p;
  void *pvVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  void *pvVar5;
  ulong uVar6;
  Aig_Obj_t *p1;
  int iVar7;
  int iVar8;
  
  if (pAig->nRegs < 1) {
    __assert_fail("Saig_ManRegNum(pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/int/intCheck.c"
                  ,0x40,"Aig_Man_t *Inter_ManUnrollFrames(Aig_Man_t *, int)");
  }
  p = Aig_ManStart((pAig->nObjs[6] + pAig->nObjs[5]) * nFrames);
  pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
  for (iVar7 = 0; iVar7 < pAig->nRegs; iVar7 = iVar7 + 1) {
    pvVar2 = Vec_PtrEntry(pAig->vCis,pAig->nTruePis + iVar7);
    pAVar3 = Aig_ObjCreateCi(p);
    *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar3;
  }
  iVar7 = 0;
  if (nFrames < 1) {
    nFrames = iVar7;
  }
  do {
    if (iVar7 == nFrames) {
      Aig_ManCleanup(p);
      return p;
    }
    for (iVar8 = 0; iVar8 < pAig->nTruePis; iVar8 = iVar8 + 1) {
      pvVar2 = Vec_PtrEntry(pAig->vCis,iVar8);
      pAVar3 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar3;
    }
    for (iVar8 = 0; iVar8 < pAig->vObjs->nSize; iVar8 = iVar8 + 1) {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,iVar8);
      if ((pAVar3 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar3->field_0x18 & 7) - 7)) {
        pAVar4 = Aig_ObjChild0Copy(pAVar3);
        if (((ulong)pAVar3 & 1) != 0) {
          __assert_fail("!Aig_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                        ,0x139,"Aig_Obj_t *Aig_ObjChild1Copy(Aig_Obj_t *)");
        }
        uVar6 = (ulong)pAVar3->pFanin1 & 0xfffffffffffffffe;
        if (uVar6 == 0) {
          p1 = (Aig_Obj_t *)0x0;
        }
        else {
          p1 = (Aig_Obj_t *)((ulong)((uint)pAVar3->pFanin1 & 1) ^ *(ulong *)(uVar6 + 0x28));
        }
        pAVar4 = Aig_And(p,pAVar4,p1);
        (pAVar3->field_5).pData = pAVar4;
      }
    }
    for (iVar8 = 0; iVar1 = pAig->nRegs, iVar8 < iVar1; iVar8 = iVar8 + 1) {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,pAig->nTruePos + iVar8);
      pAVar4 = Aig_ObjChild0Copy(pAVar3);
      (pAVar3->field_5).pData = pAVar4;
    }
    for (iVar8 = 0; iVar8 < iVar1; iVar8 = iVar8 + 1) {
      pvVar2 = Vec_PtrEntry(pAig->vCos,pAig->nTruePos + iVar8);
      pvVar5 = Vec_PtrEntry(pAig->vCis,pAig->nTruePis + iVar8);
      pAVar3 = *(Aig_Obj_t **)((long)pvVar2 + 0x28);
      *(Aig_Obj_t **)((long)pvVar5 + 0x28) = pAVar3;
      Aig_ObjCreateCo(p,pAVar3);
      iVar1 = pAig->nRegs;
    }
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

Aig_Man_t * Inter_ManUnrollFrames( Aig_Man_t * pAig, int nFrames )
{
    Aig_Man_t * pFrames;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    int i, f;
    assert( Saig_ManRegNum(pAig) > 0 );
    pFrames = Aig_ManStart( Aig_ManNodeNum(pAig) * nFrames );
    // map the constant node
    Aig_ManConst1(pAig)->pData = Aig_ManConst1( pFrames );
    // create variables for register outputs
    Saig_ManForEachLo( pAig, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pFrames );
    // add timeframes
    for ( f = 0; f < nFrames; f++ )
    {
        // create PI nodes for this frame
        Saig_ManForEachPi( pAig, pObj, i )
            pObj->pData = Aig_ObjCreateCi( pFrames );
        // add internal nodes of this frame
        Aig_ManForEachNode( pAig, pObj, i )
            pObj->pData = Aig_And( pFrames, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
        // save register inputs
        Saig_ManForEachLi( pAig, pObj, i )
            pObj->pData = Aig_ObjChild0Copy(pObj);
        // transfer to register outputs
        Saig_ManForEachLiLo(  pAig, pObjLi, pObjLo, i )
        {
            pObjLo->pData = pObjLi->pData;
            Aig_ObjCreateCo( pFrames, (Aig_Obj_t *)pObjLo->pData );
        }
    }
    Aig_ManCleanup( pFrames );
    return pFrames;
}